

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstWalker.cpp
# Opt level: O2

void __thiscall AstWalker::visitWhileStatementAstNode(AstWalker *this,WhileStatementAstNode *node)

{
  (*this->_vptr_AstWalker[0x17])();
  (*this->_vptr_AstWalker[3])
            (this,(node->expression).
                  super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  (*this->_vptr_AstWalker[2])
            (this,(node->statement).super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr);
  (*this->_vptr_AstWalker[0x26])(this,node);
  return;
}

Assistant:

void AstWalker::visitWhileStatementAstNode(WhileStatementAstNode* node) noexcept {
  this->onEnterWhileStatementAstNode(node);
  this->visitExpressionAstNode(node->expression.get());
  this->visitStatementAstNode(node->statement.get());
  this->onExitWhileStatementAstNode(node);
}